

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

CURLcode Curl_gmtime(time_t intime,tm *store)

{
  CURLcode CVar1;
  tm *ptVar2;
  time_t intime_local;
  
  intime_local = intime;
  ptVar2 = gmtime_r(&intime_local,(tm *)store);
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (ptVar2 != (tm *)0x0) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_gmtime(time_t intime, struct tm *store)
{
  const struct tm *tm;
#ifdef HAVE_GMTIME_R
  /* thread-safe version */
  tm = (struct tm *)gmtime_r(&intime, store);
#else
  tm = gmtime(&intime);
  if(tm)
    *store = *tm; /* copy the pointed struct to the local copy */
#endif

  if(!tm)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_OK;
}